

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_internal.h
# Opt level: O3

void ImGui::SetColumnWidth(int column_index,float width)

{
  ImGuiColumnsSet *pIVar1;
  
  pIVar1 = (GImGui->CurrentWindow->DC).ColumnsSet;
  if (column_index < 0) {
    column_index = pIVar1->Current;
  }
  SetColumnOffset(column_index + 1,
                  (pIVar1->MaxX - pIVar1->MinX) * (pIVar1->Columns).Data[column_index].OffsetNorm +
                  pIVar1->MinX + width);
  return;
}

Assistant:

inline    ImGuiWindow*  GetCurrentWindowRead()      { ImGuiContext& g = *GImGui; return g.CurrentWindow; }